

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall
WrappedArgsParser::WrappedArgsParser(WrappedArgsParser *this,string *pname,group *sel)

{
  char (*in_RCX) [10];
  allocator local_571;
  group *local_570;
  string local_568 [32];
  string local_548 [32];
  string local_528 [32];
  group local_508;
  group local_4c0;
  group local_478;
  parameter local_430;
  parameter local_330;
  parameter local_230;
  parameter local_130;
  
  std::__cxx11::string::string((string *)this,(string *)pname);
  local_570 = &this->selection_options;
  clipp::group::group(local_570,sel);
  clipp::option<char_const(&)[3],char_const(&)[10]>
            (&local_430,(clipp *)"-v",(char (*) [3])"--version",in_RCX);
  std::__cxx11::string::string(local_528,"shows version information",&local_571);
  std::__cxx11::string::operator=((string *)&local_430,local_528);
  clipp::parameter::parameter(&this->version,&local_430);
  std::__cxx11::string::~string(local_528);
  clipp::parameter::~parameter(&local_430);
  clipp::option<char_const(&)[3],char_const(&)[7]>
            (&local_430,(clipp *)"-h",(char (*) [3])"--help",(char (*) [7])in_RCX);
  std::__cxx11::string::string(local_548,"shows this help message",&local_571);
  std::__cxx11::string::operator=((string *)&local_430,local_548);
  clipp::parameter::parameter(&this->help,&local_430);
  std::__cxx11::string::~string(local_548);
  clipp::parameter::~parameter(&local_430);
  clipp::option<char_const(&)[3],char_const(&)[7]>
            (&local_430,(clipp *)"-i",(char (*) [3])"--info",(char (*) [7])in_RCX);
  std::__cxx11::string::string(local_568,"outputs the current session info",&local_571);
  std::__cxx11::string::operator=((string *)&local_430,local_568);
  clipp::parameter::parameter(&this->info,&local_430);
  std::__cxx11::string::~string(local_568);
  clipp::parameter::~parameter(&local_430);
  clipp::parameter::parameter(&local_130,&this->help);
  clipp::parameter::parameter(&local_230,&this->version);
  clipp::operator|(&local_4c0,&local_130,&local_230);
  clipp::parameter::parameter(&local_330,&this->info);
  clipp::operator|(&local_478,&local_4c0,&local_330);
  clipp::group::group(&local_508,local_570);
  clipp::operator|(&this->wrapper_cli,&local_478,&local_508);
  clipp::group::~group(&local_508);
  clipp::group::~group(&local_478);
  clipp::parameter::~parameter(&local_330);
  clipp::group::~group(&local_4c0);
  clipp::parameter::~parameter(&local_230);
  clipp::parameter::~parameter(&local_130);
  return;
}

Assistant:

WrappedArgsParser(const std::string& pname, const group& sel) noexcept
      : program_name(pname), selection_options(sel) {}